

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void crec_alloc(jit_State *J,RecordFFData *rd,CTypeID id)

{
  CTState *cts;
  CType *pCVar1;
  CTInfo CVar2;
  TRef TVar3;
  TRef TVar4;
  CTSize k;
  CTSize CVar5;
  TRef TVar6;
  int iVar7;
  uint uVar8;
  TRef trfill;
  uint uVar9;
  cTValue *pcVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  ushort uVar14;
  uint64_t uVar15;
  CTSize in_R8D;
  IRRef1 IVar16;
  CTSize sz;
  TValue tv;
  uint local_68;
  TRef local_64;
  CType *local_60;
  CType *local_58;
  cTValue local_50;
  RecordFFData *local_48;
  CTypeID local_3c;
  uint64_t local_38;
  
  cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  CVar2 = lj_ctype_info(cts,id,&local_68);
  local_60 = cts->tab + id;
  TVar3 = lj_ir_kint(J,id);
  if ((CVar2 & 0xf0000000) == 0x20000000) {
    TVar4 = J->base[1];
    if (TVar4 == 0) {
      TVar4 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      IVar16 = (IRRef1)TVar4;
      goto LAB_0015b634;
    }
  }
  else {
    if ((0x3ffffff < CVar2) || ((local_68 != 8 && (local_68 != 4)))) {
      local_48 = rd;
      local_3c = id;
      if ((CVar2 >> 0x14 & 1) == 0) {
        if ((CVar2 & 0xc0000) == 0) {
          TVar4 = 0x7fff;
        }
        else {
          TVar4 = lj_ir_kint(J,local_68);
        }
      }
      else {
        TVar4 = J->base[1];
        if ((TVar4 == 0) || (J->base[2] != 0)) goto LAB_0015bc9a;
        pcVar10 = rd->argv + 1;
        TVar4 = crec_ct_tv(J,cts->tab + 9,0,TVar4,pcVar10);
        pCVar1 = local_60;
        in_R8D = (CTSize)pcVar10;
        k = lj_ctype_vlsize(cts,local_60,0);
        CVar5 = lj_ctype_vlsize(cts,pCVar1,1);
        TVar6 = lj_ir_kint(J,CVar5 - k);
        (J->fold).ins.field_0.ot = 0x3793;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        TVar4 = lj_opt_fold(J);
        TVar6 = lj_ir_kint(J,k);
        (J->fold).ins.field_0.ot = 0x3593;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        TVar4 = lj_opt_fold(J);
        J->base[1] = 0;
      }
      (J->fold).ins.field_0.ot = 0x538a;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar3 = lj_opt_fold(J);
      pCVar1 = local_60;
      IVar16 = (IRRef1)TVar3;
      if (((CVar2 >> 0x14 & 1) == 0) && (local_68 < 0x81)) {
        if ((J->base[1] == 0) ||
           ((J->base[2] != 0 ||
            (iVar7 = lj_cconv_multi_init(cts,local_60,local_48->argv + 1), iVar7 != 0)))) {
          uVar13 = pCVar1->info >> 0x1c;
          if (uVar13 == 1) {
            uVar14 = pCVar1->sib;
            if (J->base[1] == 0) {
              if (uVar14 == 0) {
                uVar14 = 0;
              }
              else {
                pCVar1 = cts->tab;
                uVar12 = uVar14;
                do {
                  uVar11 = (ulong)uVar12;
                  uVar13 = pCVar1[uVar12].info >> 0x1c;
                  if ((uVar13 != 0xb) &&
                     ((uVar13 != 9 ||
                      ((((pCVar1[uVar12].name.gcptr64 != 0 &&
                         (0xfffffff < pCVar1[pCVar1[uVar12].info & 0xffff].info)) &&
                        (uVar13 = pCVar1[pCVar1[uVar12].info & 0xffff].info >> 0x1c, uVar13 != 5))
                       && (uVar13 != 2)))))) goto LAB_0015b864;
                  uVar12 = pCVar1[uVar11].sib;
                } while (pCVar1[uVar11].sib != 0);
              }
            }
            uVar13 = 1;
LAB_0015b953:
            do {
              do {
                uVar12 = uVar14;
                if (uVar12 == 0) goto LAB_0015baf3;
                pCVar1 = cts->tab;
                uVar14 = pCVar1[uVar12].sib;
                uVar8 = pCVar1[uVar12].info >> 0x1c;
              } while (uVar8 == 0xb);
              if (uVar8 != 9) goto LAB_0015bc9a;
              local_50.u64 = 0;
              uVar15 = pCVar1[uVar12].name.gcptr64;
              if (uVar15 != 0) {
                uVar9 = pCVar1[uVar12].info & 0xffff;
                uVar8 = pCVar1[uVar9].info;
                if (((0xfffffff < uVar8) && (uVar8 >> 0x1c != 2)) && (uVar8 >> 0x1c != 5))
                goto LAB_0015bc9a;
                local_38 = uVar15;
                if (J->base[uVar13] == 0) {
                  local_58 = (CType *)CONCAT44(local_58._4_4_,uVar13);
                  if ((uVar8 & 0xf0000000) == 0x20000000) {
                    local_64 = 0x7fff;
                  }
                  else {
                    local_64 = lj_ir_kint(J,0);
                  }
                  pcVar10 = &local_50;
                }
                else {
                  pcVar10 = local_48->argv + uVar13;
                  local_58 = (CType *)CONCAT44(local_58._4_4_,uVar13 + 1);
                  local_64 = J->base[uVar13];
                }
                TVar4 = lj_ir_kint64(J,(ulong)pCVar1[uVar12].size + 0x10);
                (J->fold).ins.field_0.ot = 0x2909;
                (J->fold).ins.field_0.op1 = IVar16;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
                TVar4 = lj_opt_fold(J);
                crec_ct_tv(J,pCVar1 + uVar9,TVar4,local_64,pcVar10);
                uVar13 = (uint)local_58;
                if ((local_60->info & 0x800000) == 0) goto LAB_0015b953;
                uVar15 = local_38;
                if (local_60->size != pCVar1[uVar9].size) goto LAB_0015bc9a;
              }
            } while (uVar15 == 0);
            goto LAB_0015baf3;
          }
          if (uVar13 == 3) {
            uVar8 = pCVar1->info & 0xffff;
            uVar13 = cts->tab[uVar8].info;
            local_58 = cts->tab + uVar8;
            local_50.u64 = 0;
            if ((uVar13 < 0x10000000 || (uVar13 & 0xf0000000) == 0x20000000) &&
               (local_68 <= local_58->size << 4)) {
              if (local_68 != 0) {
                local_60 = (CType *)CONCAT44(local_60._4_4_,1);
                pcVar10 = &local_50;
                uVar13 = 0;
                TVar4 = 0;
                local_64 = local_58->size;
                do {
                  TVar6 = lj_ir_kint64(J,(ulong)uVar13 + 0x10);
                  (J->fold).ins.field_0.ot = 0x2909;
                  (J->fold).ins.field_0.op1 = IVar16;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                  TVar6 = lj_opt_fold(J);
                  uVar11 = (ulong)local_60 & 0xffffffff;
                  if (J->base[uVar11] == 0) {
                    if ((int)local_60 == 2) {
                      local_60 = (CType *)CONCAT44(local_60._4_4_,2);
                    }
                    else {
                      TVar4 = 0x7fff;
                      if (local_58->info < 0x10000000) {
                        TVar4 = lj_ir_kint(J,0);
                      }
                    }
                  }
                  else {
                    pcVar10 = local_48->argv + uVar11;
                    local_60 = (CType *)CONCAT44(local_60._4_4_,(int)local_60 + 1);
                    TVar4 = J->base[uVar11];
                  }
                  crec_ct_tv(J,local_58,TVar6,TVar4,pcVar10);
                  uVar13 = uVar13 + local_64;
                } while (uVar13 < local_68);
              }
              goto LAB_0015baf3;
            }
            goto LAB_0015b864;
          }
        }
        TVar4 = lj_ir_kint64(J,0x10);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
        TVar6 = lj_opt_fold(J);
        TVar4 = J->base[1];
        if (TVar4 == 0) {
          pcVar10 = &local_50;
          local_50.u64 = 0;
          TVar4 = lj_ir_kint(J,0);
        }
        else {
          pcVar10 = local_48->argv + 1;
        }
        crec_ct_tv(J,pCVar1,TVar6,TVar4,pcVar10);
      }
      else {
LAB_0015b864:
        if (J->base[1] != 0) {
LAB_0015bc9a:
          lj_trace_err(J,LJ_TRERR_NYICONV);
        }
        TVar6 = lj_ir_kint64(J,0x10);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        TVar6 = lj_opt_fold(J);
        if (TVar4 == 0x7fff) {
          TVar4 = lj_ir_kint(J,local_68);
        }
        trfill = lj_ir_kint(J,0);
        crec_fill(J,TVar6,TVar4,trfill,in_R8D);
      }
LAB_0015baf3:
      *J->base = TVar3;
      pcVar10 = lj_ctype_meta(cts,local_3c,MM_gc);
      if (pcVar10 == (cTValue *)0x0) {
        return;
      }
      crec_finalizer(J,TVar3,0,pcVar10);
      return;
    }
    TVar4 = J->base[1];
    if (TVar4 == 0) {
      if (local_68 == 4) {
        TVar4 = lj_ir_kint(J,0);
        IVar16 = (IRRef1)TVar4;
      }
      else {
        TVar4 = lj_ir_kint64(J,0);
        IVar16 = (IRRef1)TVar4;
      }
      goto LAB_0015b634;
    }
  }
  TVar4 = crec_ct_tv(J,local_60,0,TVar4,rd->argv + 1);
  IVar16 = (IRRef1)TVar4;
LAB_0015b634:
  (J->fold).ins.field_0.ot = 0x548a;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op2 = IVar16;
  TVar3 = lj_opt_fold(J);
  *J->base = TVar3;
  return;
}

Assistant:

static void crec_alloc(jit_State *J, RecordFFData *rd, CTypeID id)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTSize sz;
  CTInfo info = lj_ctype_info(cts, id, &sz);
  CType *d = ctype_raw(cts, id);
  TRef trcd, trid = lj_ir_kint(J, id);
  cTValue *fin;
  /* Use special instruction to box pointer or 32/64 bit integer. */
  if (ctype_isptr(info) || (ctype_isinteger(info) && (sz == 4 || sz == 8))) {
    TRef sp = J->base[1] ? crec_ct_tv(J, d, 0, J->base[1], &rd->argv[1]) :
	      ctype_isptr(info) ? lj_ir_kptr(J, NULL) :
	      sz == 4 ? lj_ir_kint(J, 0) :
	      (lj_needsplit(J), lj_ir_kint64(J, 0));
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), trid, sp);
    return;
  } else {
    TRef trsz = TREF_NIL;
    if ((info & CTF_VLA)) {  /* Calculate VLA/VLS size at runtime. */
      CTSize sz0, sz1;
      if (!J->base[1] || J->base[2])
	lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init VLA/VLS. */
      trsz = crec_ct_tv(J, ctype_get(cts, CTID_INT32), 0,
			J->base[1], &rd->argv[1]);
      sz0 = lj_ctype_vlsize(cts, d, 0);
      sz1 = lj_ctype_vlsize(cts, d, 1);
      trsz = emitir(IRTGI(IR_MULOV), trsz, lj_ir_kint(J, (int32_t)(sz1-sz0)));
      trsz = emitir(IRTGI(IR_ADDOV), trsz, lj_ir_kint(J, (int32_t)sz0));
      J->base[1] = 0;  /* Simplify logic below. */
    } else if (ctype_align(info) > CT_MEMALIGN) {
      trsz = lj_ir_kint(J, sz);
    }
    trcd = emitir(IRTG(IR_CNEW, IRT_CDATA), trid, trsz);
    if (sz > 128 || (info & CTF_VLA)) {
      TRef dp;
      CTSize align;
    special:  /* Only handle bulk zero-fill for large/VLA/VLS types. */
      if (J->base[1])
	lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init large/VLA/VLS types. */
      dp = emitir(IRT(IR_ADD, IRT_PTR), trcd, lj_ir_kintp(J, sizeof(GCcdata)));
      if (trsz == TREF_NIL) trsz = lj_ir_kint(J, sz);
      align = ctype_align(info);
      if (align < CT_MEMALIGN) align = CT_MEMALIGN;
      crec_fill(J, dp, trsz, lj_ir_kint(J, 0), (1u << align));
    } else if (J->base[1] && !J->base[2] &&
	!lj_cconv_multi_init(cts, d, &rd->argv[1])) {
      goto single_init;
    } else if (ctype_isarray(d->info)) {
      CType *dc = ctype_rawchild(cts, d);  /* Array element type. */
      CTSize ofs, esize = dc->size;
      TRef sp = 0;
      TValue tv;
      TValue *sval = &tv;
      MSize i;
      tv.u64 = 0;
      if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info)) ||
	  esize * CREC_FILL_MAXUNROLL < sz)
	goto special;
      for (i = 1, ofs = 0; ofs < sz; ofs += esize) {
	TRef dp = emitir(IRT(IR_ADD, IRT_PTR), trcd,
			 lj_ir_kintp(J, ofs + sizeof(GCcdata)));
	if (J->base[i]) {
	  sp = J->base[i];
	  sval = &rd->argv[i];
	  i++;
	} else if (i != 2) {
	  sp = ctype_isnum(dc->info) ? lj_ir_kint(J, 0) : TREF_NIL;
	}
	crec_ct_tv(J, dc, dp, sp, sval);
      }
    } else if (ctype_isstruct(d->info)) {
      CTypeID fid;
      MSize i = 1;
      if (!J->base[1]) {  /* Handle zero-fill of struct-of-NYI. */
	fid = d->sib;
	while (fid) {
	  CType *df = ctype_get(cts, fid);
	  fid = df->sib;
	  if (ctype_isfield(df->info)) {
	    CType *dc;
	    if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
	    dc = ctype_rawchild(cts, df);  /* Field type. */
	    if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info) ||
		  ctype_isenum(dc->info)))
	      goto special;
	  } else if (!ctype_isconstval(df->info)) {
	    goto special;
	  }
	}
      }
      fid = d->sib;
      while (fid) {
	CType *df = ctype_get(cts, fid);
	fid = df->sib;
	if (ctype_isfield(df->info)) {
	  CType *dc;
	  TRef sp, dp;
	  TValue tv;
	  TValue *sval = &tv;
	  setintV(&tv, 0);
	  if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
	  dc = ctype_rawchild(cts, df);  /* Field type. */
	  if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info) ||
		ctype_isenum(dc->info)))
	    lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init aggregates. */
	  if (J->base[i]) {
	    sp = J->base[i];
	    sval = &rd->argv[i];
	    i++;
	  } else {
	    sp = ctype_isptr(dc->info) ? TREF_NIL : lj_ir_kint(J, 0);
	  }
	  dp = emitir(IRT(IR_ADD, IRT_PTR), trcd,
		      lj_ir_kintp(J, df->size + sizeof(GCcdata)));
	  crec_ct_tv(J, dc, dp, sp, sval);
	  if ((d->info & CTF_UNION)) {
	    if (d->size != dc->size)  /* NYI: partial init of union. */
	      lj_trace_err(J, LJ_TRERR_NYICONV);
	    break;
	  }
	} else if (!ctype_isconstval(df->info)) {
	  /* NYI: init bitfields and sub-structures. */
	  lj_trace_err(J, LJ_TRERR_NYICONV);
	}
      }
    } else {
      TRef dp;
    single_init:
      dp = emitir(IRT(IR_ADD, IRT_PTR), trcd, lj_ir_kintp(J, sizeof(GCcdata)));
      if (J->base[1]) {
	crec_ct_tv(J, d, dp, J->base[1], &rd->argv[1]);
      } else {
	TValue tv;
	tv.u64 = 0;
	crec_ct_tv(J, d, dp, lj_ir_kint(J, 0), &tv);
      }
    }
  }
  J->base[0] = trcd;
  /* Handle __gc metamethod. */
  fin = lj_ctype_meta(cts, id, MM_gc);
  if (fin)
    crec_finalizer(J, trcd, 0, fin);
}